

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O3

void update_regset_by_reg(OnigRegSet *set,regex_t *reg)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (set->n == 1) {
    set->enc = reg->enc;
    uVar1._0_4_ = reg->anchor;
    uVar1._4_4_ = reg->anc_dist_min;
    set->anchor = (undefined4)uVar1;
    set->anc_dmin = uVar1._4_4_;
    set->anc_dmax = reg->anc_dist_max;
    if (reg->optimize == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (uint)(reg->dist_max != 0xffffffff);
    }
    set->all_low_high = uVar4;
    uVar5 = (uint)(uVar1 >> 0xe) & 1;
  }
  else {
    uVar4 = reg->anchor;
    uVar5 = set->anchor & uVar4;
    if (uVar5 != 0) {
      uVar2 = reg->anc_dist_min;
      if (set->anc_dmin < reg->anc_dist_min) {
        uVar2 = set->anc_dmin;
      }
      uVar3 = reg->anc_dist_max;
      if (reg->anc_dist_max < set->anc_dmax) {
        uVar3 = set->anc_dmax;
      }
      set->anc_dmin = uVar2;
      set->anc_dmax = uVar3;
    }
    set->anchor = uVar5;
    if ((reg->optimize == 0) || (reg->dist_max == 0xffffffff)) {
      set->all_low_high = 0;
    }
    uVar5 = 1;
    if ((uVar4 >> 0xe & 1) == 0) {
      return;
    }
  }
  set->anychar_inf = uVar5;
  return;
}

Assistant:

static void
update_regset_by_reg(OnigRegSet* set, regex_t* reg)
{
  if (set->n == 1) {
    set->enc          = reg->enc;
    set->anchor       = reg->anchor;
    set->anc_dmin     = reg->anc_dist_min;
    set->anc_dmax     = reg->anc_dist_max;
    set->all_low_high =
      (reg->optimize == OPTIMIZE_NONE || reg->dist_max == INFINITE_LEN) ? 0 : 1;
    set->anychar_inf  = (reg->anchor & ANCR_ANYCHAR_INF) != 0 ? 1 : 0;
  }
  else {
    int anchor;

    anchor = set->anchor & reg->anchor;
    if (anchor != 0) {
      OnigLen anc_dmin;
      OnigLen anc_dmax;

      anc_dmin = set->anc_dmin;
      anc_dmax = set->anc_dmax;
      if (anc_dmin > reg->anc_dist_min) anc_dmin = reg->anc_dist_min;
      if (anc_dmax < reg->anc_dist_max) anc_dmax = reg->anc_dist_max;
      set->anc_dmin = anc_dmin;
      set->anc_dmax = anc_dmax;
    }

    set->anchor = anchor;

    if (reg->optimize == OPTIMIZE_NONE || reg->dist_max == INFINITE_LEN)
      set->all_low_high = 0;

    if ((reg->anchor & ANCR_ANYCHAR_INF) != 0)
      set->anychar_inf = 1;
  }
}